

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O1

bool __thiscall ON_OBSOLETE_V5_HatchExtra::CopyFrom(ON_OBSOLETE_V5_HatchExtra *this,ON_Object *src)

{
  ON_UserData *pOVar1;
  bool bVar2;
  ON_UserData *src_00;
  
  if (src == (ON_Object *)0x0) {
    src_00 = (ON_UserData *)0x0;
  }
  else {
    bVar2 = ON_Object::IsKindOf(src,&m_ON_OBSOLETE_V5_HatchExtra_class_rtti);
    src_00 = (ON_UserData *)0x0;
    if (bVar2) {
      src_00 = (ON_UserData *)src;
    }
  }
  if (src_00 != (ON_UserData *)0x0) {
    ON_UserData::operator=(&this->super_ON_UserData,src_00);
    pOVar1 = src_00[1].super_ON_Object.m_userdata_list;
    (this->m_basepoint).x = (double)src_00[1].super_ON_Object._vptr_ON_Object;
    (this->m_basepoint).y = (double)pOVar1;
  }
  return src_00 != (ON_UserData *)0x0;
}

Assistant:

ON_OBSOLETE_V5_HatchExtra* ON_OBSOLETE_V5_HatchExtra::HatchExtension(const ON_Hatch* pHatch)
{
  ON_OBSOLETE_V5_HatchExtra* pExtra = nullptr;
  if(pHatch)
  {
    pExtra = ON_OBSOLETE_V5_HatchExtra::Cast(pHatch->GetUserData(ON_CLASS_ID(ON_OBSOLETE_V5_HatchExtra)));
    if(pExtra == nullptr)
    {
      pExtra = new ON_OBSOLETE_V5_HatchExtra;
      if(pExtra)
      {
        if(!const_cast<ON_Hatch*>(pHatch)->AttachUserData(pExtra))
        {
          delete pExtra;
          pExtra = nullptr;
        }
      }  
    }
  }
  return pExtra;
}